

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KRef_Ptr.h
# Opt level: O0

KRef_Ptr<KDIS::DATA_TYPE::Descriptor> * __thiscall
KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=
          (KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *this,KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *p)

{
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *p_local;
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *this_local;
  
  if (this->m_pRef != p->m_pRef) {
    unRef(this);
    this->m_pRef = p->m_pRef;
    this->m_piCount = p->m_piCount;
    ref(this);
  }
  return this;
}

Assistant:

KRef_Ptr<Type> & operator=( const KRef_Ptr<Type> & p )
    {
        if( m_pRef == p.m_pRef )return *this;
        unRef();
        m_pRef = p.m_pRef;
        m_piCount = p.m_piCount;
        ref();
        return *this;
    }